

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void RawWrite(RawFD fd,char *buf,size_t len)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t sVar3;
  
  do {
    if (len == 0) {
      return;
    }
    do {
      sVar1 = write(fd,buf,len);
      if (-1 < sVar1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    sVar3 = sVar1;
    if (sVar1 < 1) {
      sVar3 = 0;
    }
    len = len - sVar3;
    buf = buf + sVar3;
    if (sVar1 < 1) {
      return;
    }
  } while( true );
}

Assistant:

void RawWrite(RawFD fd, const char* buf, size_t len) {
  while (len > 0) {
    ssize_t r;
    NO_INTR(r = write(fd, buf, len));
    if (r <= 0) break;
    buf += r;
    len -= r;
  }
}